

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_stack.cpp
# Opt level: O2

int do_push(void)

{
  uint uVar1;
  uint uVar2;
  undefined4 *puVar3;
  uint *puVar4;
  
  uVar1 = registe_ptr->IP;
  uVar2 = registe_ptr->SP + 4;
  registe_ptr->SP = uVar2;
  if (code_ptr[uVar1 + 1] == '\x06') {
    puVar4 = (uint *)(code_ptr + (ulong)uVar1 + 2);
  }
  else {
    if (code_ptr[uVar1 + 1] != '\x05') {
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 0xf6;
      __cxa_throw(puVar3,&int::typeinfo,0);
    }
    puVar4 = register_list[(byte)code_ptr[uVar1 + 2] >> 4];
  }
  *(uint *)(stack_ptr + uVar2) = *puVar4;
  return 1;
}

Assistant:

int do_push() {
	registe_ptr->SP += 4;//栈指针增加
	if (code_ptr[registe_ptr->IP + 1] == 5) {//寄存器压栈
		uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
		unsigned num = *register_list[high];
		*(unsigned*)(stack_ptr + registe_ptr->SP) = num;
	}
	else if (code_ptr[registe_ptr->IP + 1] == 6) {//立即数压栈
		unsigned num = *(unsigned*)(code_ptr + registe_ptr->IP + 2);
		*(unsigned*)(stack_ptr + registe_ptr->SP) = num;
	}
	else throw(LVM_EXECUTE_ERROR);
	return LVM_SUCCESS;
}